

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_handle_compressed_certificate(ptls_t *tls,ptls_iovec_t message)

{
  uint8_t *puVar1;
  ushort uVar2;
  st_ptls_decompress_certificate_t *psVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_iovec_t pVar5;
  int iVar6;
  int iVar7;
  uint8_t *src;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  uint8_t *puVar11;
  size_t sVar12;
  uint8_t *puVar13;
  ulong uVar14;
  ptls_hash_context_t **pppVar15;
  bool bVar16;
  ptls_iovec_t pVar17;
  int got_certs;
  int local_44;
  uint8_t *local_40;
  ulong uStack_38;
  
  sVar10 = message.len;
  puVar11 = message.base;
  psVar3 = tls->ctx->decompress_certificate;
  if (psVar3 == (st_ptls_decompress_certificate_t *)0x0) {
    iVar6 = 10;
  }
  else if ((long)sVar10 < 6) {
    iVar6 = 0x32;
  }
  else {
    uVar2 = *(ushort *)(puVar11 + 4);
    puVar1 = puVar11 + sVar10;
    if ((long)puVar1 - (long)(puVar11 + 6) < 3) {
      iVar6 = 0x32;
    }
    else {
      uVar9 = (uint)puVar11[8] | (uint)puVar11[7] << 8 | (uint)puVar11[6] << 0x10;
      puVar13 = puVar11 + 9;
      if (uVar9 < 0x10001) {
        src = (uint8_t *)malloc((ulong)uVar9);
        if (src != (uint8_t *)0x0) {
          iVar6 = 0x32;
          if ((ulong)((long)puVar1 - (long)puVar13) < 3) {
            bVar16 = false;
          }
          else {
            lVar8 = 0;
            uVar14 = 0;
            do {
              uVar14 = (ulong)puVar13[lVar8] | uVar14 << 8;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            puVar13 = puVar11 + 0xc;
            if ((ulong)((long)puVar1 - (long)puVar13) < uVar14) {
              bVar16 = false;
            }
            else {
              pVar5.len = uVar14;
              pVar5.base = puVar13;
              pVar17.len._0_4_ = uVar9;
              pVar17.base = src;
              pVar17.len._4_4_ = 0;
              local_40 = puVar13;
              uStack_38 = uVar14;
              iVar6 = (*psVar3->cb)(psVar3,tls,uVar2 << 8 | uVar2 >> 8,pVar17,pVar5);
              bVar16 = iVar6 == 0;
              if (bVar16) {
                puVar13 = puVar13 + uVar14;
                iVar6 = 0;
              }
            }
          }
          if ((bVar16) && (iVar6 = 0x32, puVar13 == puVar1)) {
            iVar7 = handle_certificate(tls,src,src + uVar9,&local_44);
            iVar6 = 0x2f;
            if (local_44 != 0) {
              iVar6 = 0;
            }
            if (iVar7 != 0) {
              iVar6 = iVar7;
            }
            if (iVar6 == 0) {
              ppVar4 = tls->key_schedule;
              if (ppVar4->num_hashes != 0) {
                pppVar15 = &ppVar4->hashes[0].ctx;
                sVar12 = 0;
                do {
                  (*(*pppVar15)->update)(*pppVar15,puVar11,sVar10);
                  sVar12 = sVar12 + 1;
                  pppVar15 = pppVar15 + 2;
                } while (sVar12 != ppVar4->num_hashes);
              }
              tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
              iVar6 = 0x202;
            }
          }
          goto LAB_0011b770;
        }
        iVar6 = 0x201;
      }
      else {
        iVar6 = 0x2a;
      }
    }
  }
  src = (uint8_t *)0x0;
LAB_0011b770:
  free(src);
  return iVar6;
}

Assistant:

static int client_handle_compressed_certificate(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    uint32_t uncompressed_size;
    uint8_t *uncompressed = NULL;
    int ret;

    if (tls->ctx->decompress_certificate == NULL) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode24(&uncompressed_size, &src, end)) != 0)
        goto Exit;
    if (uncompressed_size > 65536) { /* TODO find a sensible number */
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    if ((uncompressed = malloc(uncompressed_size)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    ptls_decode_block(src, end, 3, {
        if ((ret = tls->ctx->decompress_certificate->cb(tls->ctx->decompress_certificate, tls, algo,
                                                        ptls_iovec_init(uncompressed, uncompressed_size),
                                                        ptls_iovec_init(src, end - src))) != 0)
            goto Exit;
        src = end;
    });

    /* handle */
    if ((ret = client_do_handle_certificate(tls, uncompressed, uncompressed + uncompressed_size)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    free(uncompressed);
    return ret;
}